

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O3

Expected<llvm::sys::fs::TempFile> *
llvm::sys::fs::TempFile::create
          (Expected<llvm::sys::fs::TempFile> *__return_storage_ptr__,Twine *Model,uint Mode)

{
  bool bVar1;
  error_code eVar2;
  error_code EC;
  StringRef Filename;
  StringRef Name;
  int FD;
  TempFile Ret;
  SmallString<128U> ResultPath;
  anon_class_1_0_00000001 local_105;
  int local_104;
  undefined1 local_100 [24];
  undefined1 local_e8 [56];
  SmallVectorImpl<char> local_b0;
  undefined1 local_a0 [128];
  
  local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Size = 0;
  local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.Capacity = 0x80;
  local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>.
  super_SmallVectorBase.BeginX = local_a0;
  eVar2 = createUniqueEntity(Model,&local_104,&local_b0,false,Mode,FS_File,OF_Delete);
  if (eVar2._M_value == 0) {
    Name.Length._0_4_ =
         local_b0.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    Name.Data = (char *)local_b0.super_SmallVectorTemplateBase<char,_true>.
                        super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    Name.Length._4_4_ = 0;
    TempFile((TempFile *)(local_e8 + 8),Name,local_104);
    Filename.Length._0_4_ =
         local_b0.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.Size;
    Filename.Data =
         (char *)local_b0.super_SmallVectorTemplateBase<char,_true>.
                 super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX;
    Filename.Length._4_4_ = 0;
    bVar1 = RemoveFileOnSignal(Filename,(string *)0x0);
    if (bVar1) {
      discard((TempFile *)local_100);
      local_e8._0_8_ = local_100._0_8_ | 1;
      local_100._0_8_ = 0;
      handleAllErrors<llvm::consumeError(llvm::Error)::_lambda(llvm::ErrorInfoBase_const&)_1_>
                ((Error *)local_e8,&local_105);
      if ((long *)(local_e8._0_8_ & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(local_e8._0_8_ & 0xfffffffffffffffe) + 8))();
      }
      if ((long *)(local_100._0_8_ & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(local_100._0_8_ & 0xfffffffffffffffe) + 8))();
      }
      std::_V2::generic_category();
      eVar2._M_cat = (error_category *)0x1;
      eVar2._0_8_ = (Error *)(local_100 + 8);
      errorCodeToError(eVar2);
      Expected<llvm::sys::fs::TempFile>::Expected(__return_storage_ptr__,(Error *)(local_100 + 8));
      if ((long *)(local_100._8_8_ & 0xfffffffffffffffe) != (long *)0x0) {
        (**(code **)(*(long *)(local_100._8_8_ & 0xfffffffffffffffe) + 8))();
      }
    }
    else {
      __return_storage_ptr__->field_0x30 = __return_storage_ptr__->field_0x30 & 0xfe;
      TempFile((TempFile *)__return_storage_ptr__,(TempFile *)(local_e8 + 8));
    }
    ~TempFile((TempFile *)(local_e8 + 8));
  }
  else {
    EC._M_cat._0_4_ = eVar2._M_value;
    EC._0_8_ = (Error *)(local_100 + 0x10);
    EC._M_cat._4_4_ = 0;
    errorCodeToError(EC);
    Expected<llvm::sys::fs::TempFile>::Expected(__return_storage_ptr__,(Error *)(local_100 + 0x10));
    if ((long *)(local_100._16_8_ & 0xfffffffffffffffe) != (long *)0x0) {
      (**(code **)(*(long *)(local_100._16_8_ & 0xfffffffffffffffe) + 8))();
    }
  }
  if ((undefined1 *)
      local_b0.super_SmallVectorTemplateBase<char,_true>.super_SmallVectorTemplateCommon<char,_void>
      .super_SmallVectorBase.BeginX != local_a0) {
    free(local_b0.super_SmallVectorTemplateBase<char,_true>.
         super_SmallVectorTemplateCommon<char,_void>.super_SmallVectorBase.BeginX);
  }
  return __return_storage_ptr__;
}

Assistant:

Expected<TempFile> TempFile::create(const Twine &Model, unsigned Mode) {
  int FD;
  SmallString<128> ResultPath;
  if (std::error_code EC =
          createUniqueFile(Model, FD, ResultPath, Mode, OF_Delete))
    return errorCodeToError(EC);

  TempFile Ret(ResultPath, FD);
#ifndef _WIN32
  if (sys::RemoveFileOnSignal(ResultPath)) {
    // Make sure we delete the file when RemoveFileOnSignal fails.
    consumeError(Ret.discard());
    std::error_code EC(errc::operation_not_permitted);
    return errorCodeToError(EC);
  }
#endif
  return std::move(Ret);
}